

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Light.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Lighting_PointLight(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer pFVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  CX3DImporter_NodeElement_Light *pCVar6;
  allocator<char> local_131;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined4 local_d0;
  allocator<char> local_c9;
  undefined1 local_c8 [8];
  string an;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  byte local_8d;
  float radius;
  float fStack_88;
  bool on;
  aiVector3D location;
  float intensity;
  bool global;
  aiColor3D color;
  undefined1 local_60 [8];
  aiVector3D attenuation;
  float ambientIntensity;
  string use;
  string def;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(use.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&attenuation.z);
  attenuation.y = 0.0;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_60,1.0,0.0,0.0);
  aiColor3D::aiColor3D((aiColor3D *)&intensity,1.0,1.0,1.0);
  location.z._3_1_ = 1;
  location.y = 1.0;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&radius,0.0,0.0,0.0);
  local_8d = 1;
  ne._4_4_ = 100.0;
  _idx_end = (CX3DImporter_NodeElement_Light *)0x0;
  an.field_2._12_4_ = 0;
  pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  an.field_2._8_4_ =
       (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)an.field_2._12_4_ < (int)an.field_2._8_4_; an.field_2._12_4_ = an.field_2._12_4_ + 1)
  {
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar4,(ulong)(uint)an.field_2._12_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,(char *)CONCAT44(extraout_var,iVar2),&local_c9);
    std::allocator<char>::~allocator(&local_c9);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c8,"DEF");
    if (bVar1) {
      pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar4,(ulong)(uint)an.field_2._12_4_);
      std::__cxx11::string::operator=
                ((string *)(use.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_00,iVar2));
      local_d0 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c8,"USE");
      if (bVar1) {
        pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar4,(ulong)(uint)an.field_2._12_4_);
        std::__cxx11::string::operator=
                  ((string *)&attenuation.z,(char *)CONCAT44(extraout_var_01,iVar2));
        local_d0 = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c8,"bboxCenter");
        if (bVar1) {
          local_d0 = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_c8,"bboxSize");
          if (bVar1) {
            local_d0 = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_c8,"containerField");
            if (bVar1) {
              local_d0 = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_c8,"ambientIntensity");
              if (bVar1) {
                attenuation.y = XML_ReadNode_GetAttrVal_AsFloat(this,an.field_2._12_4_);
                local_d0 = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_c8,"attenuation");
                if (bVar1) {
                  XML_ReadNode_GetAttrVal_AsVec3f(this,an.field_2._12_4_,(aiVector3D *)local_60);
                  local_d0 = 4;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_c8,"color");
                  if (bVar1) {
                    XML_ReadNode_GetAttrVal_AsCol3f(this,an.field_2._12_4_,(aiColor3D *)&intensity);
                    local_d0 = 4;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_c8,"global");
                    if (bVar1) {
                      location.z._3_1_ = XML_ReadNode_GetAttrVal_AsBool(this,an.field_2._12_4_);
                      local_d0 = 4;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_c8,"intensity");
                      if (bVar1) {
                        location.y = XML_ReadNode_GetAttrVal_AsFloat(this,an.field_2._12_4_);
                        local_d0 = 4;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_c8,"location");
                        if (bVar1) {
                          XML_ReadNode_GetAttrVal_AsVec3f
                                    (this,an.field_2._12_4_,(aiVector3D *)&radius);
                          local_d0 = 4;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_c8,"on");
                          if (bVar1) {
                            local_8d = XML_ReadNode_GetAttrVal_AsBool(this,an.field_2._12_4_);
                            local_d0 = 4;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_c8,"radius");
                            if (bVar1) {
                              ne._4_4_ = XML_ReadNode_GetAttrVal_AsFloat(this,an.field_2._12_4_);
                              local_d0 = 4;
                            }
                            else {
                              Throw_IncorrectAttr(this,(string *)local_c8);
                              local_d0 = 0;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_c8);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)&attenuation.z,ENET_PointLight,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)&attenuation.z);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else if ((local_8d & 1) != 0) {
    pCVar6 = (CX3DImporter_NodeElement_Light *)operator_new(0x98);
    CX3DImporter_NodeElement_Light::CX3DImporter_NodeElement_Light
              (pCVar6,ENET_PointLight,this->NodeElement_Cur);
    _idx_end = pCVar6;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&(_idx_end->super_CX3DImporter_NodeElement).ID,
                 (string *)(use.field_2._M_local_buf + 8));
    }
    _idx_end->AmbientIntensity = attenuation.y;
    (_idx_end->Attenuation).z = attenuation.x;
    (_idx_end->Attenuation).x = (float)local_60._0_4_;
    (_idx_end->Attenuation).y = (float)local_60._4_4_;
    aiColor3D::operator=(&_idx_end->Color,(aiColor3D *)&intensity);
    _idx_end->Global = (bool)(location.z._3_1_ & 1);
    _idx_end->Intensity = location.y;
    (_idx_end->Location).z = location.x;
    (_idx_end->Location).x = radius;
    (_idx_end->Location).y = fStack_88;
    _idx_end->Radius = ne._4_4_;
    ParseHelper_Group_Begin(this,false);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      to_string<unsigned_long>(&local_110,(unsigned_long)_idx_end);
      std::operator+(&local_f0,"PointLight_",&local_110);
      std::__cxx11::string::operator=
                ((string *)&(_idx_end->super_CX3DImporter_NodeElement).ID,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
    }
    std::__cxx11::string::operator=
              ((string *)&this->NodeElement_Cur->ID,
               (string *)&(_idx_end->super_CX3DImporter_NodeElement).ID);
    ParseHelper_Node_Exit(this);
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar3 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar6 = _idx_end;
    if ((uVar3 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"PointLight",&local_131);
      ParseNode_Metadata(this,&pCVar6->super_CX3DImporter_NodeElement,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_131);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::__cxx11::string::~string((string *)&attenuation.z);
  std::__cxx11::string::~string((string *)(use.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Lighting_PointLight()
{
    std::string def, use;
    float ambientIntensity = 0;
    aiVector3D attenuation( 1, 0, 0 );
    aiColor3D color( 1, 1, 1 );
    bool global = true;
    float intensity = 1;
    aiVector3D location( 0, 0, 0 );
    bool on = true;
    float radius = 100;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ambientIntensity", ambientIntensity, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("attenuation", attenuation, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_REF("color", color, XML_ReadNode_GetAttrVal_AsCol3f);
		MACRO_ATTRREAD_CHECK_RET("global", global, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("intensity", intensity, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("location", location, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_RET("on", on, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("radius", radius, XML_ReadNode_GetAttrVal_AsFloat);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_PointLight, ne);
	}
	else
	{
		if(on)
		{
			// create and if needed - define new geometry object.
			ne = new CX3DImporter_NodeElement_Light(CX3DImporter_NodeElement::ENET_PointLight, NodeElement_Cur);
			if(!def.empty()) ne->ID = def;

			((CX3DImporter_NodeElement_Light*)ne)->AmbientIntensity = ambientIntensity;
			((CX3DImporter_NodeElement_Light*)ne)->Attenuation = attenuation;
			((CX3DImporter_NodeElement_Light*)ne)->Color = color;
			((CX3DImporter_NodeElement_Light*)ne)->Global = global;
			((CX3DImporter_NodeElement_Light*)ne)->Intensity = intensity;
			((CX3DImporter_NodeElement_Light*)ne)->Location = location;
			((CX3DImporter_NodeElement_Light*)ne)->Radius = radius;
			// Assimp want a node with name similar to a light. "Why? I don't no." )
			ParseHelper_Group_Begin(false);
			// make random name
			if(ne->ID.empty()) ne->ID = "PointLight_" + to_string((size_t)ne);

			NodeElement_Cur->ID = ne->ID;// assign name to node and return to light element.
			ParseHelper_Node_Exit();
			// check for child nodes
			if(!mReader->isEmptyElement())
				ParseNode_Metadata(ne, "PointLight");
			else
				NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

			NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
		}// if(on)
	}// if(!use.empty()) else
}